

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O1

void __thiscall embree::OBJLoader::loadMTL(OBJLoader *this,FileName *fileName)

{
  pointer pcVar1;
  double dVar2;
  long lVar3;
  __fd_mask _Var4;
  undefined8 uVar5;
  size_type sVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  *pmVar7;
  fd_set *pfVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  fd_set *pfVar14;
  mapped_type *pmVar15;
  runtime_error *prVar16;
  ostream *poVar17;
  undefined8 in_RCX;
  fd_set *__readfds;
  fd_set *__readfds_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  _Alloc_hider _Var19;
  fd_set *in_R8;
  timeval *in_R9;
  __fd_mask *p_Var20;
  float fVar21;
  char *token;
  string line;
  string name;
  string next_line;
  ifstream cin;
  __fd_mask *local_4f0;
  undefined1 local_4e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  undefined1 local_4c0 [24];
  key_type local_4a8;
  undefined1 local_488 [16];
  undefined1 local_478 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  undefined1 local_448 [152];
  element_type *local_3b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3a8;
  float local_3a0;
  undefined8 local_39c;
  undefined8 uStack_394;
  undefined8 local_38c;
  undefined1 local_384 [36];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  *local_360;
  undefined1 local_358 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_338;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_328;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_318;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_308;
  GroupNode *local_2f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2f0;
  GroupNode *local_2e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2e0;
  GroupNode *local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2d0;
  GroupNode *local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2c0;
  GroupNode *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2b0;
  GroupNode *local_2a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2a0;
  GroupNode *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_290;
  float local_288;
  GroupNode *local_280;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_278;
  float local_270;
  float local_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  float fStack_258;
  anon_union_12_2_4062524c_for_Vec3<float>_1 local_254;
  anon_union_12_2_4062524c_for_Vec3<float>_1 aStack_248;
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  cVar9 = std::__basic_file<char>::is_open();
  if (cVar9 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"cannot open ",0xc);
    pcVar1 = (fileName->filename)._M_dataplus._M_p;
    local_358._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_358 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_358,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_358._0_8_,local_358._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    _Var19._M_p = (pointer)local_358._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_358 + 0x10)) goto LAB_0013bd83;
  }
  else {
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    local_4a8._M_string_length = 0;
    local_4a8.field_2._M_local_buf[0] = '\0';
    local_358._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_358._8_8_ = 0x3f8000003f800000;
    local_358._16_4_ = 1.0;
    local_338 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    local_328._8_8_ = 0x3f8000003f800000;
    local_328._0_8_ = 0x3f8000003f800000;
    local_280 = (GroupNode *)0x0;
    _Stack_278._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    memset(&local_318,0,0x94);
    local_270 = 1.0;
    local_26c = 0.0;
    uStack_268 = 0;
    uStack_264 = 0;
    uStack_260 = 0;
    uStack_25c = 0;
    fStack_258 = 0.0;
    local_254._0_8_ = (MaterialNode *)0x3fb333333fb33333;
    local_254.field_0.z = 1.4;
    aStack_248._0_8_ = (MaterialNode *)0x4040000040400000;
    aStack_248.field_0.z = 3.0;
    local_360 = &this->material;
    local_4e8._16_8_ = this;
    while( true ) {
      iVar11 = std::istream::peek();
      if (iVar11 == -1) break;
      local_4d0._8_8_ = 0;
      local_4c0[0] = false;
      cVar9 = (char)(istream *)local_238;
      local_4d0._M_allocated_capacity = (size_type)(local_4e8 + 0x28);
      cVar10 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar9);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)(local_4e8 + 0x18),cVar10);
      do {
        if ((local_4d0._8_8_ == 0) ||
           (in_RCX = local_4d0._M_allocated_capacity,
           ((undefined1 *)(local_4d0._M_allocated_capacity - 1))[local_4d0._8_8_] != '\\')) break;
        ((undefined1 *)(local_4d0._M_allocated_capacity - 1))[local_4d0._8_8_] = 0x20;
        local_488._8_4_ = 0.0;
        local_488._12_4_ = 0.0;
        local_478._0_4_ = local_478._0_4_ & 0xffffff00;
        local_488._0_8_ = (MaterialNode *)local_478;
        cVar10 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar9);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)local_488,cVar10);
        lVar3 = CONCAT44(local_488._12_4_,local_488._8_4_);
        if (lVar3 != 0) {
          std::__cxx11::string::_M_append(local_4e8 + 0x18,local_488._0_8_);
        }
        if ((MaterialNode *)local_488._0_8_ != (MaterialNode *)local_478) {
          operator_delete((void *)local_488._0_8_);
        }
      } while (lVar3 != 0);
      uVar5 = local_4d0._M_allocated_capacity;
      sVar13 = strspn((char *)local_4d0._M_allocated_capacity," \t");
      local_4f0 = (__fd_mask *)(uVar5 + sVar13);
      if (*(char *)(uVar5 + sVar13) != '\0') {
        pfVar8 = (fd_set *)(uVar5 + sVar13 + -1);
        do {
          pfVar14 = pfVar8;
          pfVar8 = (fd_set *)((long)pfVar14->fds_bits + 1);
        } while (*(char *)((long)pfVar14->fds_bits + 1) != '\0');
        for (; ((in_RCX = ZEXT18((byte)pfVar14->fds_bits[0]), (ulong)in_RCX < (__fd_mask *)0x21 &&
                ((0x100002200U >> (in_RCX & 0x3f) & 1) != 0)) && (local_4f0 <= pfVar14));
            pfVar14 = (fd_set *)((long)pfVar14[-1].fds_bits + 0x7f)) {
          *(char *)pfVar14->fds_bits = '\0';
        }
      }
      if (((char)*local_4f0 != '\0') && ((char)*local_4f0 != '#')) {
        iVar11 = strncmp((char *)local_4f0,"newmtl",6);
        iVar12 = std::__cxx11::string::compare((char *)&local_4a8);
        p_Var20 = local_4f0;
        if (iVar11 == 0) {
          if (iVar12 != 0) {
            ExtObjMaterial::select
                      ((ExtObjMaterial *)local_488,(int)local_358,__readfds,(fd_set *)in_RCX,in_R8,
                       in_R9);
            pmVar7 = local_360;
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                      ::operator[](local_360,&local_4a8);
            if (pmVar15->ptr != (MaterialNode *)0x0) {
              (*(pmVar15->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            pmVar15->ptr = (MaterialNode *)local_488._0_8_;
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                      ::operator[](pmVar7,&local_4a8);
            std::__cxx11::string::_M_assign((string *)&(pmVar15->ptr->super_Node).name);
          }
          p_Var20 = (__fd_mask *)((long)local_4f0 + 6);
          local_4f0 = p_Var20;
          sVar13 = strspn((char *)p_Var20," \t");
          sVar6 = local_4a8._M_string_length;
          if (sVar13 == 0) {
            prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar16,"separator expected");
            goto LAB_0013be81;
          }
          in_RCX = (long)p_Var20 + sVar13;
          local_4f0 = (__fd_mask *)in_RCX;
          in_R8 = (fd_set *)strlen((char *)in_RCX);
          std::__cxx11::string::_M_replace((ulong)&local_4a8,0,(char *)sVar6,in_RCX);
          memset((ExtObjMaterial *)local_488,0,0x120);
          local_488._8_4_ = 1.0;
          local_488._12_4_ = 1.0;
          local_478._0_4_ = 1.0;
          local_478._16_8_ = (pointer)0x0;
          local_478._24_8_ = 0;
          local_458._M_allocated_capacity = 0x3f8000003f800000;
          local_458._8_8_ = 0x3f8000003f800000;
          local_3b0 = (element_type *)0x0;
          _Stack_3a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          memset(local_448,0,0x94);
          local_3a0 = 1.0;
          local_39c = 0;
          uStack_394 = 0;
          local_38c = 0;
          local_384._0_8_ = 0x3fb333333fb33333;
          local_384._8_8_ = 0x404000003fb33333;
          local_384._16_8_ = 0x4040000040400000;
          ExtObjMaterial::operator=((ExtObjMaterial *)local_358,(ExtObjMaterial *)local_488);
          ExtObjMaterial::~ExtObjMaterial((ExtObjMaterial *)local_488);
        }
        else {
          if (iVar12 == 0) {
            prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar16,"invalid material file: newmtl expected first");
LAB_0013be81:
            __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar11 = strncmp((char *)local_4f0,"illum",5);
          if (iVar11 == 0) {
            p_Var20 = (__fd_mask *)((long)p_Var20 + 5);
            local_4f0 = p_Var20;
            sVar13 = strspn((char *)p_Var20," \t");
            if (sVar13 == 0) {
              prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar16,"separator expected");
              goto LAB_0013ba5e;
            }
            local_4f0 = (__fd_mask *)((long)p_Var20 + sVar13);
          }
          else {
            _Var4 = *p_Var20;
            if ((char)_Var4 == 'd') {
              p_Var20 = (__fd_mask *)((long)p_Var20 + 1);
              local_4f0 = p_Var20;
              sVar13 = strspn((char *)p_Var20," \t");
              if (sVar13 == 0) {
                prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar16,"separator expected");
                goto LAB_0013ba5e;
              }
              p_Var20 = (__fd_mask *)((long)p_Var20 + sVar13);
              local_4f0 = p_Var20;
              sVar13 = strspn((char *)p_Var20," \t");
              p_Var20 = (__fd_mask *)((long)p_Var20 + sVar13);
              local_4f0 = p_Var20;
              dVar2 = atof((char *)p_Var20);
              local_4c0._20_4_ = (undefined4)dVar2;
              sVar13 = strcspn((char *)p_Var20," \t\r");
              local_4f0 = (__fd_mask *)((long)p_Var20 + sVar13);
              local_358._8_4_ = local_4c0._20_4_;
            }
            else {
              iVar11 = strncmp((char *)p_Var20,"Ns",2);
              if (iVar11 == 0) {
                p_Var20 = (__fd_mask *)((long)p_Var20 + 2);
                local_4f0 = p_Var20;
                sVar13 = strspn((char *)p_Var20," \t");
                if (sVar13 == 0) {
                  prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar16,"separator expected");
                  goto LAB_0013ba5e;
                }
                p_Var20 = (__fd_mask *)((long)p_Var20 + sVar13);
                local_4f0 = p_Var20;
                sVar13 = strspn((char *)p_Var20," \t");
                p_Var20 = (__fd_mask *)((long)p_Var20 + sVar13);
                local_4f0 = p_Var20;
                dVar2 = atof((char *)p_Var20);
                local_4c0._20_4_ = (undefined4)dVar2;
                sVar13 = strcspn((char *)p_Var20," \t\r");
                local_4f0 = (__fd_mask *)((long)p_Var20 + sVar13);
                local_358._12_4_ = local_4c0._20_4_;
              }
              else {
                iVar11 = strncmp((char *)p_Var20,"Ni",2);
                if (iVar11 == 0) {
                  p_Var20 = (__fd_mask *)((long)p_Var20 + 2);
                  local_4f0 = p_Var20;
                  sVar13 = strspn((char *)p_Var20," \t");
                  if (sVar13 == 0) {
                    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar16,"separator expected");
                    goto LAB_0013ba5e;
                  }
                  p_Var20 = (__fd_mask *)((long)p_Var20 + sVar13);
                  local_4f0 = p_Var20;
                  sVar13 = strspn((char *)p_Var20," \t");
                  p_Var20 = (__fd_mask *)((long)p_Var20 + sVar13);
                  local_4f0 = p_Var20;
                  dVar2 = atof((char *)p_Var20);
                  local_4c0._20_4_ = (undefined4)dVar2;
                  sVar13 = strcspn((char *)p_Var20," \t\r");
                  local_4f0 = (__fd_mask *)((long)p_Var20 + sVar13);
                  local_358._16_4_ = local_4c0._20_4_;
                }
                else {
                  iVar11 = strncmp((char *)p_Var20,"map_d",5);
                  if (iVar11 == 0) {
LAB_0013b098:
                    p_Var20 = (__fd_mask *)((long)p_Var20 + 5);
                    local_4f0 = p_Var20;
                    sVar13 = strspn((char *)p_Var20," \t");
                    if (sVar13 == 0) {
                      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar16,"separator expected");
LAB_0013ba5e:
                      __cxa_throw(prVar16,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_4f0 = (__fd_mask *)((long)p_Var20 + sVar13);
                    FileName::FileName((FileName *)local_488,(char *)local_4f0);
                    loadTexture((OBJLoader *)local_4e8,(FileName *)local_4e8._16_8_);
                    _Var18._M_pi = _Stack_2f0._M_pi;
                    local_2f8 = (GroupNode *)local_4e8._0_8_;
                    _Stack_2f0._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_;
                  }
                  else {
                    iVar11 = strncmp((char *)p_Var20,"d_map",5);
                    if (iVar11 == 0) goto LAB_0013b098;
                    iVar11 = strncmp((char *)p_Var20,"map_Ka",6);
                    if (iVar11 == 0) {
LAB_0013b1a1:
                      p_Var20 = (__fd_mask *)((long)p_Var20 + 6);
                      local_4f0 = p_Var20;
                      sVar13 = strspn((char *)p_Var20," \t");
                      if (sVar13 == 0) {
                        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar16,"separator expected");
                        goto LAB_0013ba5e;
                      }
                      local_4f0 = (__fd_mask *)((long)p_Var20 + sVar13);
                      FileName::FileName((FileName *)local_488,(char *)local_4f0);
                      loadTexture((OBJLoader *)local_4e8,(FileName *)local_4e8._16_8_);
                      _Var18._M_pi = _Stack_2e0._M_pi;
                      local_2e8 = (GroupNode *)local_4e8._0_8_;
                      _Stack_2e0._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_;
                    }
                    else {
                      iVar11 = strncmp((char *)p_Var20,"Ka_map",6);
                      if (iVar11 == 0) goto LAB_0013b1a1;
                      iVar11 = strncmp((char *)p_Var20,"map_Kd",6);
                      if (iVar11 == 0) {
LAB_0013b213:
                        p_Var20 = (__fd_mask *)((long)p_Var20 + 6);
                        local_4f0 = p_Var20;
                        sVar13 = strspn((char *)p_Var20," \t");
                        if (sVar13 == 0) {
                          prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(prVar16,"separator expected");
                          goto LAB_0013ba5e;
                        }
                        local_4f0 = (__fd_mask *)((long)p_Var20 + sVar13);
                        FileName::FileName((FileName *)local_488,(char *)local_4f0);
                        loadTexture((OBJLoader *)local_4e8,(FileName *)local_4e8._16_8_);
                        _Var18._M_pi = _Stack_2d0._M_pi;
                        local_2d8 = (GroupNode *)local_4e8._0_8_;
                        _Stack_2d0._M_pi =
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_;
                      }
                      else {
                        iVar11 = strncmp((char *)p_Var20,"Kd_map",6);
                        if (iVar11 == 0) goto LAB_0013b213;
                        iVar11 = strncmp((char *)p_Var20,"map_Ks",6);
                        if (iVar11 == 0) {
LAB_0013b285:
                          local_4f0 = (__fd_mask *)((long)p_Var20 + 6);
                          parseSep((char **)&local_4f0);
                          FileName::FileName((FileName *)local_488,(char *)local_4f0);
                          loadTexture((OBJLoader *)local_4e8,(FileName *)local_4e8._16_8_);
                          _Var18._M_pi = _Stack_2c0._M_pi;
                          local_2c8 = (GroupNode *)local_4e8._0_8_;
                          _Stack_2c0._M_pi =
                               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_;
                        }
                        else {
                          iVar11 = strncmp((char *)p_Var20,"Ks_map",6);
                          if (iVar11 == 0) goto LAB_0013b285;
                          iVar11 = strncmp((char *)p_Var20,"map_Kt",6);
                          if (iVar11 == 0) {
LAB_0013b2e3:
                            local_4f0 = (__fd_mask *)((long)p_Var20 + 6);
                            parseSep((char **)&local_4f0);
                            FileName::FileName((FileName *)local_488,(char *)local_4f0);
                            loadTexture((OBJLoader *)local_4e8,(FileName *)local_4e8._16_8_);
LAB_0013b35d:
                            _Var18._M_pi = _Stack_2b0._M_pi;
                            local_2b8 = (GroupNode *)local_4e8._0_8_;
                            _Stack_2b0._M_pi =
                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_;
                          }
                          else {
                            iVar11 = strncmp((char *)p_Var20,"Kt_map",6);
                            if (iVar11 == 0) goto LAB_0013b2e3;
                            iVar11 = strncmp((char *)p_Var20,"map_Tf",6);
                            if (iVar11 == 0) {
LAB_0013b321:
                              local_4f0 = (__fd_mask *)((long)p_Var20 + 6);
                              parseSep((char **)&local_4f0);
                              FileName::FileName((FileName *)local_488,(char *)local_4f0);
                              loadTexture((OBJLoader *)local_4e8,(FileName *)local_4e8._16_8_);
                              goto LAB_0013b35d;
                            }
                            iVar11 = strncmp((char *)p_Var20,"Tf_map",6);
                            if (iVar11 == 0) goto LAB_0013b321;
                            iVar11 = strncmp((char *)p_Var20,"map_Ns",6);
                            if (iVar11 == 0) {
LAB_0013b3ab:
                              local_4f0 = (__fd_mask *)((long)p_Var20 + 6);
                              parseSep((char **)&local_4f0);
                              FileName::FileName((FileName *)local_488,(char *)local_4f0);
                              loadTexture((OBJLoader *)local_4e8,(FileName *)local_4e8._16_8_);
                              local_2a8 = (GroupNode *)local_4e8._0_8_;
                              _Var18._M_pi = _Stack_2a0._M_pi;
                              _Stack_2a0._M_pi =
                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_;
                            }
                            else {
                              iVar11 = strncmp((char *)p_Var20,"Ns_map",6);
                              if (iVar11 == 0) goto LAB_0013b3ab;
                              iVar11 = strncmp((char *)p_Var20,"map_Displ",9);
                              if (iVar11 != 0) {
                                iVar11 = strncmp((char *)p_Var20,"Displ_map",9);
                                if (iVar11 != 0) {
                                  iVar11 = strncmp((char *)p_Var20,"Ka",2);
                                  if (iVar11 == 0) {
                                    local_4f0 = (__fd_mask *)((long)p_Var20 + 2);
                                    parseSep((char **)&local_4f0);
                                    getVec3f((embree *)local_488,(char **)&local_4f0);
                                    local_338.m128[2] = (float)local_488._8_4_;
                                    local_338._0_8_ = local_488._0_8_;
                                    local_338.m128[3] = 0.0;
                                  }
                                  else {
                                    iVar11 = strncmp((char *)p_Var20,"Kd",2);
                                    if (iVar11 == 0) {
                                      local_4f0 = (__fd_mask *)((long)p_Var20 + 2);
                                      parseSep((char **)&local_4f0);
                                      goto LAB_0013b4c7;
                                    }
                                    iVar11 = strncmp((char *)p_Var20,"Ks",2);
                                    if (iVar11 == 0) {
                                      local_4f0 = (__fd_mask *)((long)p_Var20 + 2);
                                      parseSep((char **)&local_4f0);
                                      getVec3f((embree *)local_488,(char **)&local_4f0);
                                      local_318.m128[2] = (float)local_488._8_4_;
                                      local_318._0_8_ = local_488._0_8_;
                                      local_318.m128[3] = 0.0;
                                    }
                                    else {
                                      iVar11 = strncmp((char *)p_Var20,"Kt",2);
                                      if (iVar11 == 0) {
                                        local_4f0 = (__fd_mask *)((long)p_Var20 + 2);
                                        parseSep((char **)&local_4f0);
                                      }
                                      else {
                                        iVar11 = strncmp((char *)p_Var20,"Tf",2);
                                        if (iVar11 != 0) {
                                          iVar11 = strncmp((char *)p_Var20,"type",4);
                                          if (iVar11 == 0) {
                                            local_4f0 = (__fd_mask *)((long)p_Var20 + 4);
                                            parseSep((char **)&local_4f0);
                                            std::__cxx11::string::string
                                                      ((string *)local_488,(char *)local_4f0,
                                                       (allocator *)local_4e8);
                                            iVar11 = std::__cxx11::string::compare(local_488);
                                            if (iVar11 == 0) {
                                              local_358._0_4_ = 1;
                                            }
                                            else {
                                              iVar11 = std::__cxx11::string::compare(local_488);
                                              if (iVar11 == 0) {
                                                local_358._0_4_ = 2;
                                              }
                                              else {
                                                iVar11 = std::__cxx11::string::compare(local_488);
                                                if (iVar11 == 0) {
                                                  local_358._0_4_ = 3;
                                                }
                                                else {
                                                  iVar11 = std::__cxx11::string::compare(local_488);
                                                  if (iVar11 == 0) {
                                                    local_358._0_4_ = 4;
                                                  }
                                                  else {
                                                    iVar11 = std::__cxx11::string::compare
                                                                       (local_488);
                                                    if (iVar11 != 0) {
                                                      iVar11 = std::__cxx11::string::compare
                                                                         (local_488);
                                                      if (iVar11 != 0) goto LAB_0013b86f;
                                                    }
                                                    local_358._0_8_ =
                                                         local_358._0_8_ & 0xffffffff00000000;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else {
                                            iVar11 = strncmp((char *)p_Var20,"baseColor",9);
                                            if (iVar11 == 0) {
                                              local_4f0 = (__fd_mask *)((long)p_Var20 + 9);
                                              parseSep((char **)&local_4f0);
                                              goto LAB_0013b4c7;
                                            }
                                            iVar11 = strncmp((char *)p_Var20,"ior",3);
                                            if (iVar11 == 0) {
                                              local_4f0 = (__fd_mask *)((long)p_Var20 + 3);
                                              parseSep((char **)&local_4f0);
                                              local_358._16_4_ = getFloat((char **)&local_4f0);
                                              goto LAB_0013b189;
                                            }
                                            iVar11 = strncmp((char *)p_Var20,"map_baseColor",0xd);
                                            if (iVar11 == 0) {
                                              local_4f0 = (__fd_mask *)((long)p_Var20 + 0xd);
                                              parseSep((char **)&local_4f0);
                                              FileName::FileName((FileName *)local_488,
                                                                 (char *)local_4f0);
                                              loadTexture((OBJLoader *)local_4e8,
                                                          (FileName *)local_4e8._16_8_);
LAB_0013b6fd:
                                              _Var18._M_pi = _Stack_2d0._M_pi;
                                              local_2d8 = (GroupNode *)local_4e8._0_8_;
                                              _Stack_2d0._M_pi =
                                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   local_4e8._8_8_;
                                            }
                                            else {
                                              iVar11 = strncmp((char *)p_Var20,"map_specular",0xc);
                                              if (iVar11 != 0) {
                                                iVar11 = strncmp((char *)p_Var20,"map_normal.scale",
                                                                 0x10);
                                                if (iVar11 == 0) {
                                                  local_4f0 = p_Var20 + 2;
                                                  parseSep((char **)&local_4f0);
                                                }
                                                else {
                                                  iVar11 = strncmp((char *)p_Var20,"map_normal",10);
                                                  if (iVar11 == 0) {
                                                    local_4f0 = (__fd_mask *)((long)p_Var20 + 10);
                                                    parseSep((char **)&local_4f0);
                                                    FileName::FileName((FileName *)local_488,
                                                                       (char *)local_4f0);
                                                    loadTexture((OBJLoader *)local_4e8,
                                                                (FileName *)local_4e8._16_8_);
LAB_0013b839:
                                                    _Var18._M_pi = _Stack_290._M_pi;
                                                    local_298 = (GroupNode *)local_4e8._0_8_;
                                                    _Stack_290._M_pi =
                                                         (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_4e8._8_8_;
                                                  goto LAB_0013b856;
                                                  }
                                                  iVar11 = strncmp((char *)p_Var20,
                                                                   "transmissionColor",0x11);
                                                  if (iVar11 == 0) {
                                                    local_4f0 = (__fd_mask *)((long)p_Var20 + 0x11);
                                                    parseSep((char **)&local_4f0);
                                                    goto LAB_0013b571;
                                                  }
                                                  iVar11 = strncmp((char *)p_Var20,"transmission",
                                                                   0xc);
                                                  if (iVar11 == 0) {
                                                    local_4f0 = (__fd_mask *)((long)p_Var20 + 0xc);
                                                    parseSep((char **)&local_4f0);
                                                    fVar21 = getFloat((char **)&local_4f0);
                                                    local_308.m128[1] = fVar21;
                                                    local_308.m128[0] = fVar21;
                                                    local_308.m128[2] = fVar21;
                                                    local_308.m128[3] = 0.0;
                                                  }
                                                  else {
                                                    iVar11 = strncmp((char *)p_Var20,"roughnessMap",
                                                                     0xc);
                                                    if (iVar11 == 0) {
                                                      local_4f0 = (__fd_mask *)((long)p_Var20 + 0xc)
                                                      ;
                                                      parseSep((char **)&local_4f0);
                                                      FileName::FileName((FileName *)local_488,
                                                                         (char *)local_4f0);
                                                      loadTexture((OBJLoader *)local_4e8,
                                                                  (FileName *)local_4e8._16_8_);
                                                      local_280 = (GroupNode *)local_4e8._0_8_;
                                                      _Var18._M_pi = _Stack_278._M_pi;
                                                      _Stack_278._M_pi =
                                                           (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_4e8._8_8_;
                                                  goto LAB_0013b856;
                                                  }
                                                  iVar11 = strncmp((char *)p_Var20,"roughness",9);
                                                  if (iVar11 == 0) {
                                                    local_4f0 = (__fd_mask *)((long)p_Var20 + 9);
                                                    parseSep((char **)&local_4f0);
                                                    local_288 = getFloat((char **)&local_4f0);
                                                    local_358._12_4_ = 1.0 / (local_288 + 1e-06);
                                                  }
                                                  else {
                                                    iVar11 = strncmp((char *)p_Var20,"colorMap",8);
                                                    if (iVar11 == 0) {
                                                      local_4f0 = p_Var20 + 1;
                                                      parseSep((char **)&local_4f0);
                                                      FileName::FileName((FileName *)local_488,
                                                                         (char *)local_4f0);
                                                      loadTexture((OBJLoader *)local_4e8,
                                                                  (FileName *)local_4e8._16_8_);
                                                      goto LAB_0013b6fd;
                                                    }
                                                    iVar11 = strncmp((char *)p_Var20,"color",5);
                                                    if (iVar11 == 0) {
                                                      local_4f0 = (__fd_mask *)((long)p_Var20 + 5);
                                                      parseSep((char **)&local_4f0);
                                                    }
                                                    else {
                                                      iVar11 = strncmp((char *)p_Var20,"coat.color",
                                                                       10);
                                                      if (iVar11 != 0) {
                                                        iVar11 = strncmp((char *)p_Var20,"coat.eta",
                                                                         8);
                                                        if (iVar11 == 0) {
                                                          local_4f0 = p_Var20 + 1;
                                                          parseSep((char **)&local_4f0);
                                                          local_270 = getFloat((char **)&local_4f0);
                                                        }
                                                        else {
                                                          iVar11 = strncmp((char *)p_Var20,
                                                                           "coat.roughnessMap",0x11)
                                                          ;
                                                          if (iVar11 == 0) {
                                                            local_4f0 = (__fd_mask *)
                                                                        ((long)p_Var20 + 0x11);
                                                            parseSep((char **)&local_4f0);
                                                            FileName::FileName((FileName *)local_488
                                                                               ,(char *)local_4f0);
                                                            loadTexture((OBJLoader *)local_4e8,
                                                                        (FileName *)local_4e8._16_8_
                                                                       );
                                                            _Var18._M_pi = (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  CONCAT44(uStack_25c,uStack_260);
                                                  uStack_268 = (undefined4)local_4e8._0_8_;
                                                  uStack_264 = SUB84(local_4e8._0_8_,4);
                                                  uStack_260 = (undefined4)local_4e8._8_8_;
                                                  uStack_25c = SUB84(local_4e8._8_8_,4);
                                                  goto LAB_0013b856;
                                                  }
                                                  iVar11 = strncmp((char *)p_Var20,"coat.roughness",
                                                                   0xe);
                                                  if (iVar11 == 0) {
                                                    local_4f0 = (__fd_mask *)((long)p_Var20 + 0xe);
                                                    parseSep((char **)&local_4f0);
                                                    local_26c = getFloat((char **)&local_4f0);
                                                  }
                                                  else {
                                                    iVar11 = strncmp((char *)p_Var20,"bumpMap",7);
                                                    if (iVar11 == 0) {
                                                      local_4f0 = (__fd_mask *)((long)p_Var20 + 7);
                                                      parseSep((char **)&local_4f0);
                                                      FileName::FileName((FileName *)local_488,
                                                                         (char *)local_4f0);
                                                      loadTexture((OBJLoader *)local_4e8,
                                                                  (FileName *)local_4e8._16_8_);
                                                      goto LAB_0013b839;
                                                    }
                                                    iVar11 = strncmp((char *)p_Var20,"bump",4);
                                                    if (iVar11 == 0) {
                                                      local_4f0 = (__fd_mask *)((long)p_Var20 + 4);
                                                      parseSep((char **)&local_4f0);
                                                      fStack_258 = getFloat((char **)&local_4f0);
                                                    }
                                                    else {
                                                      iVar11 = strncmp((char *)p_Var20,"eta",3);
                                                      if (iVar11 == 0) {
                                                        local_4f0 = (__fd_mask *)((long)p_Var20 + 3)
                                                        ;
                                                        parseSep((char **)&local_4f0);
                                                        getVec3f((embree *)local_488,
                                                                 (char **)&local_4f0);
                                                        local_254._0_8_ = local_488._0_8_;
                                                        local_254.field_0.z = (float)local_488._8_4_
                                                        ;
                                                      }
                                                      else if ((char)_Var4 == 'k') {
                                                        local_4f0 = (__fd_mask *)((long)p_Var20 + 1)
                                                        ;
                                                        parseSep((char **)&local_4f0);
                                                        getVec3f((embree *)local_488,
                                                                 (char **)&local_4f0);
                                                        aStack_248.field_0.z =
                                                             (float)local_488._8_4_;
                                                        aStack_248._0_8_ = local_488._0_8_;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  goto LAB_0013b189;
                                                  }
                                                  local_4f0 = (__fd_mask *)((long)p_Var20 + 10);
                                                  parseSep((char **)&local_4f0);
                                                  }
LAB_0013b4c7:
                                                  getVec3f((embree *)local_488,(char **)&local_4f0);
                                                  local_328.m128[2] = (float)local_488._8_4_;
                                                  local_328._0_8_ = local_488._0_8_;
                                                  local_328.m128[3] = 0.0;
                                                  }
                                                  }
                                                }
                                                goto LAB_0013b189;
                                              }
                                              local_4f0 = (__fd_mask *)((long)p_Var20 + 0xc);
                                              parseSep((char **)&local_4f0);
                                              FileName::FileName((FileName *)local_488,
                                                                 (char *)local_4f0);
                                              loadTexture((OBJLoader *)local_4e8,
                                                          (FileName *)local_4e8._16_8_);
                                              _Var18._M_pi = _Stack_2c0._M_pi;
                                              local_2c8 = (GroupNode *)local_4e8._0_8_;
                                              _Stack_2c0._M_pi =
                                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   local_4e8._8_8_;
                                            }
LAB_0013b856:
                                            local_4e8._8_8_ =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                            ;
                                            local_4e8._0_8_ = (GroupNode *)0x0;
                                            if (_Var18._M_pi !=
                                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                            {
                                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                              _M_release(_Var18._M_pi);
                                            }
                                            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                local_4e8._8_8_ !=
                                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                            {
                                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                              _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_4e8._8_8_);
                                            }
                                          }
LAB_0013b86f:
                                          if ((MaterialNode *)local_488._0_8_ !=
                                              (MaterialNode *)local_478) {
                                            operator_delete((void *)local_488._0_8_);
                                          }
                                          goto LAB_0013b189;
                                        }
                                        local_4f0 = (__fd_mask *)((long)p_Var20 + 2);
                                        parseSep((char **)&local_4f0);
                                      }
LAB_0013b571:
                                      getVec3f((embree *)local_488,(char **)&local_4f0);
                                      local_308.m128[2] = (float)local_488._8_4_;
                                      local_308._0_8_ = local_488._0_8_;
                                      local_308.m128[3] = 0.0;
                                    }
                                  }
                                  goto LAB_0013b189;
                                }
                              }
                              local_4f0 = (__fd_mask *)((long)p_Var20 + 9);
                              parseSep((char **)&local_4f0);
                              FileName::FileName((FileName *)local_488,(char *)local_4f0);
                              loadTexture((OBJLoader *)local_4e8,(FileName *)local_4e8._16_8_);
                              local_298 = (GroupNode *)local_4e8._0_8_;
                              _Var18._M_pi = _Stack_290._M_pi;
                              _Stack_290._M_pi =
                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_;
                            }
                          }
                        }
                      }
                    }
                  }
                  local_4e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_4e8._0_8_ = (GroupNode *)0x0;
                  if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_);
                  }
                  if ((MaterialNode *)local_488._0_8_ != (MaterialNode *)local_478) {
                    operator_delete((void *)local_488._0_8_);
                  }
                }
              }
            }
          }
        }
      }
LAB_0013b189:
      if ((fd_set *)local_4d0._M_allocated_capacity != (fd_set *)(local_4e8 + 0x28)) {
        operator_delete((void *)local_4d0._M_allocated_capacity);
      }
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_4a8);
    if (iVar11 != 0) {
      ExtObjMaterial::select
                ((ExtObjMaterial *)local_488,(int)local_358,__readfds_00,(fd_set *)in_RCX,in_R8,
                 in_R9);
      pmVar7 = local_360;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                ::operator[](local_360,&local_4a8);
      if (pmVar15->ptr != (MaterialNode *)0x0) {
        (*(pmVar15->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pmVar15->ptr = (MaterialNode *)local_488._0_8_;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                ::operator[](pmVar7,&local_4a8);
      std::__cxx11::string::_M_assign((string *)&(pmVar15->ptr->super_Node).name);
    }
    std::ifstream::close();
    ExtObjMaterial::~ExtObjMaterial((ExtObjMaterial *)local_358);
    _Var19._M_p = local_4a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p == &local_4a8.field_2) goto LAB_0013bd83;
  }
  operator_delete(_Var19._M_p);
LAB_0013bd83:
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void OBJLoader::loadMTL(const FileName &fileName)
  {
    std::ifstream cin;
    cin.open(fileName.c_str());
    if (!cin.is_open()) {
      std::cerr << "cannot open " << fileName.str() << std::endl;
      return;
    }

    std::string name;
    ExtObjMaterial cur;

    while (cin.peek() != -1)
    {
      /* load next multiline */
      std::string line; std::getline(cin,line);
      while (!line.empty() && line[line.size()-1] == '\\') {
	line[line.size()-1] = ' ';
	std::string next_line; std::getline(cin,next_line);
	if (next_line.empty()) break;
	line += next_line;
      }
      const char* token = trimEnd(line.c_str() + strspn(line.c_str(), " \t"));

      if (token[0] == 0  ) continue; // ignore empty lines
      if (token[0] == '#') continue; // ignore comments

      if (!strncmp(token, "newmtl", 6)) 
      {
        if (name != "") {
          material[name] = cur.select();
          material[name]->name = name;
        }
        
        parseSep(token+=6);
        name = token;
        cur = ExtObjMaterial();
        continue;
      }
      if (name == "") THROW_RUNTIME_ERROR("invalid material file: newmtl expected first");
      
      try 
      {
        if (!strncmp(token, "illum", 5)) { parseSep(token += 5);  continue; }
        
        if (!strncmp(token, "d",  1)) { parseSep(token += 1);  cur.d  = getFloat(token); continue; }
        if (!strncmp(token, "Ns", 2)) { parseSep(token += 2);  cur.Ns = getFloat(token); continue; }
        if (!strncmp(token, "Ni", 2)) { parseSep(token += 2);  cur.Ni = getFloat(token); continue; }
        
        if (!strncmp(token, "map_d", 5) || !strncmp(token, "d_map", 5)) {
          parseSep(token += 5);
          cur.map_d = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ka", 6) || !strncmp(token, "Ka_map", 6)) {
          parseSep(token += 6);
          cur.map_Ka = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Kd", 6) || !strncmp(token, "Kd_map", 6)) {
          parseSep(token += 6);
          cur.map_Kd = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ks", 6) || !strncmp(token, "Ks_map", 6)) {
          parseSep(token += 6);
          cur.map_Ks = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Kt", 6) || !strncmp(token, "Kt_map", 6)) {
          parseSep(token += 6);
          cur.map_Kt = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Tf", 6) || !strncmp(token, "Tf_map", 6)) {
          parseSep(token += 6);
          cur.map_Kt = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ns", 6) || !strncmp(token, "Ns_map", 6)) {
          parseSep(token += 6);
          cur.map_Ns = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Displ", 9) || !strncmp(token, "Displ_map", 9)) {
          parseSep(token += 9);
          cur.map_Displ = loadTexture(FileName(token));
          continue;
        }
        
        if (!strncmp(token, "Ka", 2)) { parseSep(token += 2);  cur.Ka = getVec3f(token); continue; }
        if (!strncmp(token, "Kd", 2)) { parseSep(token += 2);  cur.Kd = getVec3f(token); continue; }
        if (!strncmp(token, "Ks", 2)) { parseSep(token += 2);  cur.Ks = getVec3f(token); continue; }
        if (!strncmp(token, "Kt", 2)) { parseSep(token += 2);  cur.Kt = getVec3f(token); continue; }
        if (!strncmp(token, "Tf", 2)) { parseSep(token += 2);  cur.Kt = getVec3f(token); continue; }
        
        /* extended OBJ */
        if (!strncmp(token, "type", 4)) {
          parseSep(token += 4); std::string type = token;
          if      (type == "matte") cur.type = ExtObjMaterial::MATTE;
          else if (type == "glass") cur.type = ExtObjMaterial::GLASS;
          else if (type == "metal") cur.type = ExtObjMaterial::METAL;
          else if (type == "metallicPaint") cur.type = ExtObjMaterial::METALLIC_PAINT;
          else if (type == "principled") cur.type = ExtObjMaterial::NONE;
          else if (type == "luminous") cur.type = ExtObjMaterial::NONE;
          continue;
        }

        /* OSPRay principled material extensions */
        if (!strncmp(token, "baseColor",         9)) { parseSep(token +=  9); cur.Kd  = getVec3f(token); continue; }
        if (!strncmp(token, "ior",               3)) { parseSep(token +=  3); cur.Ni = getFloat(token); continue; }
        if (!strncmp(token, "map_baseColor",    13)) { parseSep(token += 13); cur.map_Kd = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "map_specular",     12)) { parseSep(token += 12); cur.map_Ks = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "map_normal.scale", 16)) { parseSep(token += 16); continue; }
        if (!strncmp(token, "map_normal",       10)) { parseSep(token += 10); cur.map_Displ = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "transmissionColor",17)) { parseSep(token += 17); cur.Kt = getVec3f(token); continue; }
        if (!strncmp(token, "transmission",     12)) { parseSep(token += 12); cur.Kt = Vec3f(getFloat(token)); continue; }
                
        if (!strncmp(token, "roughnessMap",     12)) { parseSep(token += 12); cur.roughnessMap = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "roughness",         9)) { parseSep(token +=  9); cur.roughness = getFloat(token); cur.Ns = 1.0f/(cur.roughness+1E-6f); continue; }
        if (!strncmp(token, "colorMap",          8)) { parseSep(token +=  8); cur.map_Kd  = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "color",             5)) { parseSep(token +=  5); cur.Kd      = getVec3f(token); continue; }
        if (!strncmp(token, "coat.color",       10)) { parseSep(token += 10); cur.Kd      = getVec3f(token); continue; }
        if (!strncmp(token, "coat.eta",          8)) { parseSep(token +=  8); cur.coat_eta  = getFloat(token); continue; }
        if (!strncmp(token, "coat.roughnessMap",17)) { parseSep(token += 17); cur.coat_roughnessMap   = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "coat.roughness",   14)) { parseSep(token += 14); cur.coat_roughness = getFloat(token); continue; }
        if (!strncmp(token, "bumpMap",           7)) { parseSep(token +=  7); cur.map_Displ = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "bump",              4)) { parseSep(token +=  4); cur.bump   = getFloat(token); continue; }
        if (!strncmp(token, "eta",               3)) { parseSep(token +=  3); cur.eta = getVec3f(token); continue; }
        if (!strncmp(token, "k",                 1)) { parseSep(token +=  1); cur.k = getVec3f(token); continue; }
      } 
      catch (const std::runtime_error& e) {
        std::cerr << "Error: " << e.what() << std::endl;
      }
    }

    if (name != "") {
      material[name] = cur.select();
      material[name]->name = name;
    }

    cin.close();
  }